

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f,Instr instr,Ptr *out_trap)

{
  pointer puVar1;
  Store *this_00;
  Memory *pMVar2;
  uint uVar3;
  RunResult RVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Value VVar8;
  Value VVar9;
  Value value;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar8 = Pop(this);
  VVar9 = Pop(this);
  pMVar2 = local_80.obj_;
  uVar7 = (ulong)instr.field_2.imm_u32x2.snd;
  if ((VVar9.i32_ + instr.field_2.imm_u32x2.snd & 3) == 0) {
    uVar5 = VVar9.i64_ & 0xffffffff;
    uVar6 = uVar5 + uVar7 + 4;
    puVar1 = ((local_80.obj_)->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar6 <= (ulong)((long)((local_80.obj_)->data_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      uVar3 = *(uint *)(puVar1 + uVar7 + uVar5);
      value.i64_._4_4_ = 0;
      value.i32_ = uVar3;
      uVar3 = (*f)(uVar3,VVar8.i32_);
      puVar1 = (pMVar2->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      value._8_8_ = (long)(pMVar2->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1;
      if (uVar6 <= value._8_8_) {
        *(uint *)(puVar1 + uVar7 + uVar5) = uVar3;
        Push(this,value);
        RVar4 = Ok;
        goto LAB_0024b466;
      }
    }
  }
  this_00 = this->store_;
  StringPrintf_abi_cxx11_
            (&local_68,"invalid atomic access at %u+%u",VVar9.i64_ & 0xffffffff,
             (ulong)instr.field_2.imm_u32x2.snd);
  Store::
  Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
            (&local_48,this_00,this_00,&local_68,&this->frames_);
  out_trap->obj_ = local_48.obj_;
  out_trap->store_ = local_48.store_;
  out_trap->root_index_ = local_48.root_index_;
  local_48.obj_ = (Trap *)0x0;
  local_48.store_ = (Store *)0x0;
  local_48.root_index_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  RVar4 = Trap;
LAB_0024b466:
  if (local_80.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar4;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = Pop<T>();
  u32 offset = Pop<u32>();
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}